

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botl.c
# Opt level: O2

char * rank_of(int lev,short monnum,boolean female)

{
  char *pcVar1;
  Role *pRVar2;
  char *pcVar3;
  Role *pRVar4;
  uint uVar5;
  
  for (pRVar2 = roles;
      ((pRVar4 = &urole, (pRVar2->name).m != (char *)0x0 &&
       (pRVar4 = pRVar2, pRVar2->malenum != monnum)) && (pRVar2->femalenum != monnum));
      pRVar2 = pRVar2 + 1) {
  }
  uVar5 = 0;
  if (2 < lev) {
    if ((uint)lev < 0x1f) {
      uVar5 = lev + 2U >> 2;
    }
    else {
      uVar5 = 8;
    }
  }
  while( true ) {
    if ((int)uVar5 < 0) {
      if ((female != '\0') && (pcVar1 = (pRVar4->name).f, pcVar1 != (char *)0x0)) {
        return pcVar1;
      }
      pcVar1 = (pRVar4->name).m;
      pcVar3 = "Player";
      if (pcVar1 != (char *)0x0) {
        pcVar3 = pcVar1;
      }
      return pcVar3;
    }
    if ((female != '\0') && (pcVar1 = pRVar4->rank[uVar5].f, pcVar1 != (char *)0x0)) break;
    pcVar1 = pRVar4->rank[uVar5].m;
    uVar5 = uVar5 - 1;
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
  }
  return pcVar1;
}

Assistant:

const char *rank_of(int lev, short monnum, boolean female)
{
	struct Role *role;
	int i;


	/* Find the role */
	for (role = (struct Role *) roles; role->name.m; role++)
	    if (monnum == role->malenum || monnum == role->femalenum)
	    	break;
	if (!role->name.m)
	    role = &urole;

	/* Find the rank */
	for (i = xlev_to_rank((int)lev); i >= 0; i--) {
	    if (female && role->rank[i].f) return role->rank[i].f;
	    if (role->rank[i].m) return role->rank[i].m;
	}

	/* Try the role name, instead */
	if (female && role->name.f) return role->name.f;
	else if (role->name.m) return role->name.m;
	return "Player";
}